

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O0

ReadFileResult
cmCMakePresetsGraphInternal::PresetVectorStringHelper
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *out,Value *value)

{
  int iVar1;
  ReadFileResult RVar2;
  _func_ReadFileResult_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_Value_ptr
  *in_R8;
  Value *value_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *out_local;
  
  if (PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*)
      ::helper_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*)
                                 ::helper_abi_cxx11_);
    if (iVar1 != 0) {
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
      Vector<std::__cxx11::string,cmCMakePresetsGraph::ReadFileResult(*)(std::__cxx11::string&,Json::Value_const*)>
                (&PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*)
                  ::helper_abi_cxx11_,
                 (cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult> *)0x0,INVALID_PRESET,
                 0x205940,in_R8);
      __cxa_atexit(std::
                   function<cmCMakePresetsGraph::ReadFileResult_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                   ::~function,
                   &PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*)
                    ::helper_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*)
                           ::helper_abi_cxx11_);
    }
  }
  RVar2 = std::
          function<cmCMakePresetsGraph::ReadFileResult_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
          ::operator()(&PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*)
                        ::helper_abi_cxx11_,out,value);
  return RVar2;
}

Assistant:

cmCMakePresetsGraph::ReadFileResult PresetVectorStringHelper(
  std::vector<std::string>& out, const Json::Value* value)
{
  static auto const helper = JSONHelperBuilder::Vector<std::string>(
    ReadFileResult::READ_OK, ReadFileResult::INVALID_PRESET,
    cmCMakePresetsGraphInternal::PresetStringHelper);

  return helper(out, value);
}